

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

Clifford * operator/(Clifford *__return_storage_ptr__,float tv,Clifford *A)

{
  float fVar1;
  Clifford local_a8;
  vector<Blade,_std::allocator<Blade>_> local_90;
  Clifford local_78;
  Clifford local_60;
  vector<Blade,_std::allocator<Blade>_> local_48;
  vector<Blade,_std::allocator<Blade>_> local_30;
  
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_48,A);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_90,A);
  operator!(&local_78,&local_90);
  operator*(&local_60,&local_48,&local_78);
  if (local_60.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_60.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar1 = 0.0;
  }
  else {
    fVar1 = (local_60.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
             super__Vector_impl_data._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_60);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_78);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_90);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_48);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_30,A);
  operator!(&local_a8,&local_30);
  operator*(__return_storage_ptr__,tv / fVar1,&local_a8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Clifford operator/(float tv, Clifford A)
{
	float n;
	n <= (A*(!A));
	return((tv/n)*(!A));
}